

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment-map.c
# Opt level: O0

_Bool mi_is_in_heap_region(void *p)

{
  _Bool _Var1;
  
  _Var1 = mi_is_valid_pointer(p);
  return _Var1;
}

Assistant:

bool mi_is_in_heap_region(const void* p) mi_attr_noexcept {
  return mi_is_valid_pointer(p);
}